

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_8b0f81::HBDTemporalFilterTest::SetUp(HBDTemporalFilterTest *this)

{
  _func_void_yv12_buffer_config_ptr_macroblockd_ptr_BLOCK_SIZE_int_int_int_double_ptr_mv_ptr_int_ptr_int_int_int_uchar_ptr_uint_ptr_unsigned_short_ptr
  *p_Var1;
  ParamType *pPVar2;
  uint16_t *puVar3;
  pointer *__ptr;
  SEARCH_METHODS *pSVar4;
  Message local_38;
  AssertHelper local_30;
  AssertionResult gtest_ar;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
           ::GetParam();
  p_Var1 = (pPVar2->
           super__Tuple_impl<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
           ).
           super__Head_base<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_false>
           ._M_head_impl.tst_func;
  (this->params_).ref_func =
       (pPVar2->
       super__Tuple_impl<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
       ).
       super__Head_base<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_false>
       ._M_head_impl.ref_func;
  (this->params_).tst_func = p_Var1;
  (this->params_).bit_depth =
       (pPVar2->
       super__Tuple_impl<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
       ).
       super__Head_base<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_false>
       ._M_head_impl.bit_depth;
  pPVar2 = testing::
           WithParamInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>_>
           ::GetParam();
  this->tf_wgt_calc_lvl_ =
       (pPVar2->
       super__Tuple_impl<0UL,_libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
       ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  (this->rnd_).random_.state_ = 0xbaba;
  puVar3 = (uint16_t *)aom_memalign(0x10,0x1800);
  this->src1_ = puVar3;
  puVar3 = (uint16_t *)aom_memalign(0x10,0x1800);
  this->src2_ = puVar3;
  local_38.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
            ((internal *)&gtest_ar,"src1_","nullptr",&this->src1_,(void **)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_38);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = *(SEARCH_METHODS **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/temporal_filter_test.cc"
               ,0x1c2,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_38.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_38.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
              ((internal *)&gtest_ar,"src2_","nullptr",&this->src2_,(void **)&local_38);
    if (gtest_ar.success_ == false) {
      testing::Message::Message(&local_38);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = *(SEARCH_METHODS **)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/temporal_filter_test.cc"
                 ,0x1c3,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_30,&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_38.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_38.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void SetUp() override {
    params_ = GET_PARAM(0);
    tf_wgt_calc_lvl_ = GET_PARAM(1);
    rnd_.Reset(ACMRandom::DeterministicSeed());
    src1_ = reinterpret_cast<uint16_t *>(
        aom_memalign(16, sizeof(uint16_t) * MAX_MB_PLANE * BH * BW));
    src2_ = reinterpret_cast<uint16_t *>(
        aom_memalign(16, sizeof(uint16_t) * MAX_MB_PLANE * BH * BW));

    ASSERT_NE(src1_, nullptr);
    ASSERT_NE(src2_, nullptr);
  }